

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O2

int scan_modifiers(uint8_t *p,uint len)

{
  char *__s;
  ulong uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t __n;
  int iVar5;
  ulong uVar6;
  
  iVar5 = 0;
  uVar6 = 0x4c;
  while( true ) {
    if ((int)uVar6 <= iVar5) {
      return -1;
    }
    uVar1 = (long)(iVar5 + (int)uVar6) / 2;
    iVar2 = (int)uVar1;
    __s = modlist[iVar2].name;
    sVar4 = strlen(__s);
    __n = (size_t)len;
    if ((uint)sVar4 < len) {
      __n = sVar4 & 0xffffffff;
    }
    iVar3 = strncmp((char *)p,__s,__n);
    if ((iVar3 == 0) && (iVar3 = len - (uint)sVar4, iVar3 == 0)) break;
    if (iVar3 < 1) {
      uVar6 = uVar1 & 0xffffffff;
    }
    else {
      iVar5 = iVar2 + 1;
    }
  }
  return iVar2;
}

Assistant:

static int
scan_modifiers(const uint8_t *p, unsigned int len)
{
int bot = 0;
int top = MODLISTCOUNT;

while (top > bot)
  {
  int mid = (bot + top)/2;
  unsigned int mlen = strlen(modlist[mid].name);
  int c = strncmp((char *)p, modlist[mid].name, (len < mlen)? len : mlen);
  if (c == 0)
    {
    if (len == mlen) return mid;
    c = len - mlen;
    }
  if (c > 0) bot = mid + 1; else top = mid;
  }

return -1;

}